

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void VR4_SSE2(uint8_t *dst)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 auVar13 [16];
  undefined1 uVar14;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  int iVar15;
  
  bVar2 = dst[-1];
  bVar3 = dst[-0x21];
  uVar1 = *(ulong *)(dst + -0x21);
  auVar17._0_8_ = uVar1 >> 8;
  auVar17._8_8_ = 0;
  uVar4 = uVar1 & 0xffffffffffff00;
  auVar13._8_8_ = uVar1 >> 0x38;
  auVar13._0_8_ = uVar4 << 8 | (ulong)CONCAT11(bVar3,bVar2);
  uVar6 = (undefined1)(uVar1 >> 8);
  auVar16[0] = pavgb(bVar2,uVar6);
  uVar7 = (undefined1)(uVar1 >> 0x10);
  auVar16[1] = pavgb(bVar3,uVar7);
  uVar8 = (undefined1)(uVar1 >> 0x18);
  auVar16[2] = pavgb((char)(uVar4 >> 8),uVar8);
  uVar9 = (undefined1)(uVar1 >> 0x20);
  auVar16[3] = pavgb((char)(uVar4 >> 0x10),uVar9);
  uVar10 = (undefined1)(uVar1 >> 0x28);
  auVar16[4] = pavgb((char)(uVar4 >> 0x18),uVar10);
  uVar11 = (undefined1)(uVar1 >> 0x30);
  auVar16[5] = pavgb((char)(uVar4 >> 0x20),uVar11);
  uVar12 = (undefined1)(uVar1 >> 0x38);
  auVar16[6] = pavgb((char)(uVar4 >> 0x28),uVar12);
  auVar16[7] = pavgb((char)(uVar4 >> 0x30),0);
  auVar16[8] = pavgb(uVar12,0);
  auVar16[9] = pavgb(0,0);
  auVar16[10] = pavgb(0,0);
  auVar16[0xb] = pavgb(0,0);
  auVar16[0xc] = pavgb(0,0);
  auVar16[0xd] = pavgb(0,0);
  auVar16[0xe] = pavgb(0,0);
  auVar16[0xf] = pavgb(0,0);
  auVar17 = psubusb(auVar16,(auVar13 ^ auVar17) & _DAT_00142ae0);
  uVar14 = pavgb(auVar17[0],(char)uVar1);
  uVar18 = pavgb(auVar17[1],uVar6);
  uVar19 = pavgb(auVar17[2],uVar7);
  uVar20 = pavgb(auVar17[3],uVar8);
  iVar15 = CONCAT13(uVar20,CONCAT12(uVar19,CONCAT11(uVar18,uVar14)));
  pavgb(auVar17[4],uVar9);
  pavgb(auVar17[5],uVar10);
  pavgb(auVar17[6],uVar11);
  pavgb(auVar17[7],uVar12);
  pavgb(auVar17[8],0);
  pavgb(auVar17[9],0);
  pavgb(auVar17[10],0);
  pavgb(auVar17[0xb],0);
  pavgb(auVar17[0xc],0);
  pavgb(auVar17[0xd],0);
  pavgb(auVar17[0xe],0);
  pavgb(auVar17[0xf],0);
  uVar14 = pavgb((char)uVar1,uVar6);
  uVar6 = pavgb(uVar6,uVar7);
  uVar7 = pavgb(uVar7,uVar8);
  uVar8 = pavgb(uVar8,uVar9);
  iVar5 = CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,uVar14)));
  pavgb(uVar9,uVar10);
  pavgb(uVar10,uVar11);
  pavgb(uVar11,uVar12);
  pavgb(uVar12,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  pavgb(0,0);
  *(int *)dst = iVar5;
  *(int *)(dst + 0x20) = iVar15;
  *(int *)(dst + 0x40) = iVar5 << 8;
  *(int *)(dst + 0x60) = iVar15 << 8;
  dst[0x40] = (uint8_t)((uint)dst[0x1f] + (uint)bVar2 * 2 + (uint)bVar3 + 2 >> 2);
  dst[0x60] = (uint8_t)((uint)dst[0x3f] + (uint)bVar2 + (uint)dst[0x1f] * 2 + 2 >> 2);
  return;
}

Assistant:

static void VR4_SSE2(uint8_t* dst) {   // Vertical-Right
  const __m128i one = _mm_set1_epi8(1);
  const int I = dst[-1 + 0 * BPS];
  const int J = dst[-1 + 1 * BPS];
  const int K = dst[-1 + 2 * BPS];
  const int X = dst[-1 - BPS];
  const __m128i XABCD = _mm_loadl_epi64((__m128i*)(dst - BPS - 1));
  const __m128i ABCD0 = _mm_srli_si128(XABCD, 1);
  const __m128i abcd = _mm_avg_epu8(XABCD, ABCD0);
  const __m128i _XABCD = _mm_slli_si128(XABCD, 1);
  const __m128i IXABCD = _mm_insert_epi16(_XABCD, (short)(I | (X << 8)), 0);
  const __m128i avg1 = _mm_avg_epu8(IXABCD, ABCD0);
  const __m128i lsb = _mm_and_si128(_mm_xor_si128(IXABCD, ABCD0), one);
  const __m128i avg2 = _mm_subs_epu8(avg1, lsb);
  const __m128i efgh = _mm_avg_epu8(avg2, XABCD);
  WebPUint32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(               abcd    ));
  WebPUint32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(               efgh    ));
  WebPUint32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(abcd, 1)));
  WebPUint32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(_mm_slli_si128(efgh, 1)));

  // these two are hard to implement in SSE2, so we keep the C-version:
  DST(0, 2) = AVG3(J, I, X);
  DST(0, 3) = AVG3(K, J, I);
}